

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

Gia_Man_t *
Gia_ManIsoReduce(Gia_Man_t *pInit,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                int fDualOut,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Ptr_t *pVVar7;
  Gia_Man_t *pGVar8;
  abctime aVar9;
  void **ppvVar10;
  Vec_Int_t *pVVar11;
  int *pPos;
  Vec_Int_t **local_100;
  int local_bc;
  int Entry;
  int i_1;
  Vec_Int_t *vTemp;
  abctime clk;
  int nUsedPos;
  int nClasses;
  int Counter;
  int iPo;
  int sStart;
  int s;
  int k;
  int i;
  Vec_Str_t *vStr2;
  Vec_Str_t *vStr;
  Vec_Int_t *vLevel2;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRemain;
  Vec_Ptr_t *vStrings;
  Vec_Ptr_t *vEquivs2;
  Vec_Ptr_t *vEquivs;
  Gia_Man_t *pPart;
  Gia_Man_t *p;
  int local_30;
  int fVerbose_local;
  int fDualOut_local;
  int fEstimate_local;
  Vec_Ptr_t **pvPiPerms_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Gia_Man_t *pInit_local;
  
  p._4_4_ = fVerbose;
  local_30 = fDualOut;
  fVerbose_local = fEstimate;
  _fDualOut_local = pvPiPerms;
  pvPiPerms_local = pvPosEquivs;
  pvPosEquivs_local = (Vec_Ptr_t **)pInit;
  aVar6 = Abc_Clock();
  if (pvPiPerms_local != (Vec_Ptr_t **)0x0) {
    *pvPiPerms_local = (Vec_Ptr_t *)0x0;
  }
  if (_fDualOut_local != (Vec_Ptr_t **)0x0) {
    iVar1 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
    pVVar7 = Vec_PtrStart(iVar1);
    *_fDualOut_local = pVVar7;
  }
  if (local_30 == 0) {
    iVar1 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
    if (iVar1 == 1) {
      pGVar8 = Gia_ManDup((Gia_Man_t *)pvPosEquivs_local);
      return pGVar8;
    }
    pPart = (Gia_Man_t *)pvPosEquivs_local;
  }
  else {
    uVar2 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
    if ((uVar2 & 1) != 0) {
      __assert_fail("(Gia_ManPoNum(pInit) & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x443,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    iVar1 = Gia_ManPoNum((Gia_Man_t *)pvPosEquivs_local);
    if (iVar1 == 2) {
      pGVar8 = Gia_ManDup((Gia_Man_t *)pvPosEquivs_local);
      return pGVar8;
    }
    vEquivs = (Vec_Ptr_t *)Gia_ManTransformMiter((Gia_Man_t *)pvPosEquivs_local);
    pPart = (Gia_Man_t *)vEquivs;
    pPart = Gia_ManSeqStructSweep((Gia_Man_t *)vEquivs,1,1,0);
    Gia_ManStop((Gia_Man_t *)vEquivs);
  }
  vEquivs2 = Gia_IsoDeriveEquivPos(pPart,1,fVeryVerbose);
  if (vEquivs2 == (Vec_Ptr_t *)0x0) {
    if (local_30 != 0) {
      Gia_ManStop(pPart);
    }
    pInit_local = (Gia_Man_t *)0x0;
  }
  else {
    clk._4_4_ = Vec_IntCountNonTrivial(vEquivs2,(int *)&clk);
    uVar2 = Gia_ManPoNum(pPart);
    uVar3 = Vec_PtrSize(vEquivs2);
    printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
           ,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)clk,(ulong)clk._4_4_);
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar9 - aVar6);
    if (fVerbose_local == 0) {
      nUsedPos = 0;
      vStrings = Vec_PtrAlloc(100);
      for (s = 0; iVar5 = s, iVar4 = Vec_PtrSize(vEquivs2), iVar1 = nUsedPos, iVar5 < iVar4;
          s = s + 1) {
        vLevel2 = (Vec_Int_t *)Vec_PtrEntry(vEquivs2,s);
        iVar1 = Vec_IntSize(vLevel2);
        pVVar7 = vStrings;
        if (iVar1 < 2) {
          pVVar11 = Vec_IntDup(vLevel2);
          Vec_PtrPush(pVVar7,pVVar11);
          for (sStart = 0; iVar1 = sStart, iVar5 = Vec_IntSize(vLevel2), iVar1 < iVar5;
              sStart = sStart + 1) {
            nUsedPos = nUsedPos + 1;
            if (nUsedPos % 100 == 0) {
              printf("%6d finished...\r");
            }
          }
        }
        else {
          if (p._4_4_ != 0) {
            nClasses = Vec_IntEntry(vLevel2,0);
            iVar1 = s;
            uVar2 = Vec_IntSize(vLevel2);
            printf("%6d %6d %6d : ",(ulong)(uint)iVar1,(ulong)uVar2,(ulong)(uint)nClasses);
            vEquivs = (Vec_Ptr_t *)Gia_ManDupCones(pPart,&nClasses,1,1);
            Gia_ManPrintStats((Gia_Man_t *)vEquivs,(Gps_Par_t *)0x0);
            Gia_ManStop((Gia_Man_t *)vEquivs);
          }
          Counter = Vec_PtrSize(vStrings);
          vRemain = (Vec_Int_t *)Vec_PtrAlloc(100);
          for (sStart = 0; iVar1 = sStart, iVar5 = Vec_IntSize(vLevel2), iVar1 < iVar5;
              sStart = sStart + 1) {
            nClasses = Vec_IntEntry(vLevel2,sStart);
            nUsedPos = nUsedPos + 1;
            if (nUsedPos % 100 == 0) {
              printf("%6d finished...\r",(ulong)(uint)nUsedPos);
            }
            if ((_fDualOut_local != (Vec_Ptr_t **)0x0) &&
               (ppvVar10 = Vec_PtrArray(*_fDualOut_local), ppvVar10[nClasses] != (void *)0x0)) {
              __assert_fail("pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                            ,0x480,
                            "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                           );
            }
            pGVar8 = pPart;
            iVar1 = nClasses;
            if (_fDualOut_local == (Vec_Ptr_t **)0x0) {
              local_100 = (Vec_Int_t **)0x0;
            }
            else {
              ppvVar10 = Vec_PtrArray(*_fDualOut_local);
              local_100 = (Vec_Int_t **)(ppvVar10 + nClasses);
            }
            vStr2 = Gia_ManIsoFindString(pGVar8,iVar1,0,local_100);
            for (iPo = 0; iVar1 = iPo, iVar5 = Vec_PtrSize((Vec_Ptr_t *)vRemain), iVar1 < iVar5;
                iPo = iPo + 1) {
              _k = (Vec_Str_t *)Vec_PtrEntry((Vec_Ptr_t *)vRemain,iPo);
              iVar1 = Vec_StrCompareVec(vStr2,_k);
              if (iVar1 == 0) break;
            }
            iVar1 = iPo;
            iVar5 = Vec_PtrSize((Vec_Ptr_t *)vRemain);
            if (iVar1 == iVar5) {
              Vec_PtrPush((Vec_Ptr_t *)vRemain,vStr2);
              pVVar7 = vStrings;
              pVVar11 = Vec_IntAlloc(8);
              Vec_PtrPush(pVVar7,pVVar11);
            }
            else {
              Vec_StrFree(vStr2);
            }
            vStr = (Vec_Str_t *)Vec_PtrEntry(vStrings,Counter + iPo);
            Vec_IntPush((Vec_Int_t *)vStr,nClasses);
          }
          Vec_VecFree((Vec_Vec_t *)vRemain);
        }
      }
      iVar5 = Gia_ManPoNum(pPart);
      if (iVar1 != iVar5) {
        __assert_fail("Counter == Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x499,
                      "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                     );
      }
      Vec_VecSortByFirstInt((Vec_Vec_t *)vStrings,0);
      Vec_VecFree((Vec_Vec_t *)vEquivs2);
      vEquivs2 = vStrings;
      vLevel = Vec_IntAlloc(100);
      for (s = 0; iVar1 = s, iVar5 = Vec_PtrSize(vEquivs2), iVar1 < iVar5; s = s + 1) {
        vLevel2 = (Vec_Int_t *)Vec_PtrEntry(vEquivs2,s);
        pVVar11 = vLevel;
        iVar1 = Vec_IntEntry(vLevel2,0);
        Vec_IntPush(pVVar11,iVar1);
      }
      if (local_30 != 0) {
        iVar1 = Vec_IntSize(vLevel);
        pVVar11 = Vec_IntAlloc(iVar1);
        for (local_bc = 0; iVar1 = Vec_IntSize(vLevel), local_bc < iVar1; local_bc = local_bc + 1) {
          iVar1 = Vec_IntEntry(vLevel,local_bc);
          Vec_IntPush(pVVar11,iVar1 << 1);
          Vec_IntPush(pVVar11,iVar1 * 2 + 1);
        }
        Vec_IntFree(vLevel);
        vLevel = pVVar11;
        Gia_ManStop(pPart);
        pPart = (Gia_Man_t *)pvPosEquivs_local;
      }
      pGVar8 = pPart;
      pPos = Vec_IntArray(vLevel);
      iVar1 = Vec_IntSize(vLevel);
      vEquivs = (Vec_Ptr_t *)Gia_ManDupCones(pGVar8,pPos,iVar1,0);
      Vec_IntFree(vLevel);
      clk._4_4_ = Vec_IntCountNonTrivial(vEquivs2,(int *)&clk);
      if (local_30 == 0) {
        uVar2 = Gia_ManPoNum(pPart);
        uVar3 = Vec_PtrSize(vEquivs2);
        printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
               ,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)clk,(ulong)clk._4_4_);
      }
      else {
        iVar1 = Gia_ManPoNum(pPart);
        iVar5 = Gia_ManPoNum((Gia_Man_t *)vEquivs);
        printf("Reduced %d dual outputs to %d dual outputs.  ",(ulong)(uint)(iVar1 / 2),
               (long)iVar5 / 2 & 0xffffffff);
      }
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar9 - aVar6);
      if (p._4_4_ != 0) {
        printf("Nontrivial classes:\n");
        Vec_VecPrintInt((Vec_Vec_t *)vEquivs2,1);
      }
      if (pvPiPerms_local == (Vec_Ptr_t **)0x0) {
        Vec_VecFree((Vec_Vec_t *)vEquivs2);
      }
      else {
        *pvPiPerms_local = vEquivs2;
      }
      pInit_local = (Gia_Man_t *)vEquivs;
    }
    else {
      Vec_VecFree((Vec_Vec_t *)vEquivs2);
      pInit_local = Gia_ManDup((Gia_Man_t *)pvPosEquivs_local);
    }
  }
  return pInit_local;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce( Gia_Man_t * pInit, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fDualOut, int fVerbose, int fVeryVerbose )
{ 
    Gia_Man_t * p, * pPart;
    Vec_Ptr_t * vEquivs, * vEquivs2, * vStrings;
    Vec_Int_t * vRemain, * vLevel, * vLevel2;
    Vec_Str_t * vStr, * vStr2;
    int i, k, s, sStart, iPo, Counter;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    if ( pvPosEquivs )
        *pvPosEquivs = NULL;
    if ( pvPiPerms )
        *pvPiPerms = Vec_PtrStart( Gia_ManPoNum(pInit) );

    if ( fDualOut )
    {
        assert( (Gia_ManPoNum(pInit) & 1) == 0 );
        if ( Gia_ManPoNum(pInit) == 2 )
            return Gia_ManDup(pInit);
        p = Gia_ManTransformMiter( pInit );
        p = Gia_ManSeqStructSweep( pPart = p, 1, 1, 0 );
        Gia_ManStop( pPart );
    }
    else
    {
        if ( Gia_ManPoNum(pInit) == 1 )
            return Gia_ManDup(pInit);
        p = pInit;
    }

    // create preliminary equivalences
    vEquivs = Gia_IsoDeriveEquivPos( p, 1, fVeryVerbose );
    if ( vEquivs == NULL )
    {
        if ( fDualOut )
            Gia_ManStop( p );
        return NULL;
    }
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
        return Gia_ManDup(pInit);
    }

    // perform refinement of equivalence classes
    Counter = 0;
    vEquivs2 = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) < 2 )
        {
            Vec_PtrPush( vEquivs2, Vec_IntDup(vLevel) );
            for ( k = 0; k < Vec_IntSize(vLevel); k++ )
                if ( ++Counter % 100 == 0 )
                    printf( "%6d finished...\r", Counter );
            continue;
        }

        if ( fVerbose )
        {
            iPo = Vec_IntEntry(vLevel, 0);
            printf( "%6d %6d %6d : ", i, Vec_IntSize(vLevel), iPo );
            pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
            Gia_ManPrintStats(pPart, NULL);
            Gia_ManStop( pPart );
        }

        sStart = Vec_PtrSize( vEquivs2 ); 
        vStrings = Vec_PtrAlloc( 100 );
        Vec_IntForEachEntry( vLevel, iPo, k )
        {
            if ( ++Counter % 100 == 0 )
                printf( "%6d finished...\r", Counter );
            assert( pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL );
            vStr = Gia_ManIsoFindString( p, iPo, 0, pvPiPerms ? (Vec_Int_t **)Vec_PtrArray(*pvPiPerms) + iPo : NULL );

//            printf( "Output %2d : ", iPo );
//            Vec_IntPrint( Vec_PtrArray(*pvPiPerms)[iPo] );

            // check if this string already exists
            Vec_PtrForEachEntry( Vec_Str_t *, vStrings, vStr2, s )
                if ( Vec_StrCompareVec(vStr, vStr2) == 0 )
                    break;
            if ( s == Vec_PtrSize(vStrings) )
            {
                Vec_PtrPush( vStrings, vStr );
                Vec_PtrPush( vEquivs2, Vec_IntAlloc(8) );
            }
            else
                Vec_StrFree( vStr );
            // add this entry to the corresponding level
            vLevel2 = (Vec_Int_t *)Vec_PtrEntry( vEquivs2, sStart + s );
            Vec_IntPush( vLevel2, iPo );
        }
//        if ( Vec_PtrSize(vEquivs2) - sStart > 1 )
//            printf( "Refined class %d into %d classes.\n", i, Vec_PtrSize(vEquivs2) - sStart );
        Vec_VecFree( (Vec_Vec_t *)vStrings );
    }
    assert( Counter == Gia_ManPoNum(p) );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vEquivs2, 0 );
    Vec_VecFree( (Vec_Vec_t *)vEquivs );
    vEquivs = vEquivs2;

    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    if ( fDualOut )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vRemain) );
        int i, Entry;
        Vec_IntForEachEntry( vRemain, Entry, i )
        {
//            printf( "%d ", Entry );
            Vec_IntPush( vTemp, 2*Entry );
            Vec_IntPush( vTemp, 2*Entry+1 );
        }
//        printf( "\n" );
        Vec_IntFree( vRemain );
        vRemain = vTemp;
        Gia_ManStop( p );
        p = pInit;
    }


    // derive the resulting AIG
    pPart = Gia_ManDupCones( p, Vec_IntArray(vRemain), Vec_IntSize(vRemain), 0 );
    Vec_IntFree( vRemain );
    // report the results
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    if ( !fDualOut )
        printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
            Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    else
        printf( "Reduced %d dual outputs to %d dual outputs.  ", Gia_ManPoNum(p)/2, Gia_ManPoNum(pPart)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = vEquivs;
    else
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}